

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O0

void __thiscall
Lib::UniquePersistentIterator<Lib::VirtualIterator<Kernel::Term_*>_>::~UniquePersistentIterator
          (UniquePersistentIterator<Lib::VirtualIterator<Kernel::Term_*>_> *this)

{
  UniquePersistentIterator<Lib::VirtualIterator<Kernel::Term_*>_> *in_RDI;
  
  ~UniquePersistentIterator(in_RDI);
  ::operator_delete(in_RDI,0x20);
  return;
}

Assistant:

~UniquePersistentIterator()
  {
    if(_items) {
      ItemList::destroy(_items);
    }
  }